

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector32::equals(UVector32 *this,UVector32 *other)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->count;
  uVar4 = 0;
  if (uVar3 == other->count) {
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        return '\x01';
      }
      piVar1 = this->elements + uVar4;
      piVar2 = other->elements + uVar4;
      uVar4 = uVar4 + 1;
    } while (*piVar1 == *piVar2);
  }
  return '\0';
}

Assistant:

UBool   UVector32::equals(const UVector32 &other) const {
    int      i;

    if (this->count != other.count) {
        return FALSE;
    }
    for (i=0; i<count; i++) {
        if (elements[i] != other.elements[i]) {
            return FALSE;
        }
    }
    return TRUE;
}